

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O3

void __thiscall
gl4cts::DirectStateAccess::Framebuffers::TextureAttachmentErrorsTest::TextureAttachmentErrorsTest
          (TextureAttachmentErrorsTest *this,Context *context)

{
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"framebuffers_texture_attachment_errors",
             "Texture Attachment Errors Test");
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_020e5348;
  this->m_fbo_valid = 0;
  this->m_to_valid = 0;
  this->m_to_3d_valid = 0;
  this->m_to_array_valid = 0;
  this->m_to_cubearray_valid = 0;
  this->m_tbo_valid = 0;
  this->m_fbo_invalid = 0;
  this->m_to_invalid = 0;
  this->m_to_layer_invalid = 0;
  this->m_color_attachment_invalid = 0;
  this->m_attachment_invalid = 0;
  this->m_level_invalid = 0;
  this->m_max_3d_texture_size = 0x800;
  this->m_max_3d_texture_depth = 0x800;
  this->m_max_array_texture_layers = 0x800;
  this->m_max_cube_map_texture_size = 0x4000;
  return;
}

Assistant:

TextureAttachmentErrorsTest::TextureAttachmentErrorsTest(deqp::Context& context)
	: deqp::TestCase(context, "framebuffers_texture_attachment_errors", "Texture Attachment Errors Test")
	, m_fbo_valid(0)
	, m_to_valid(0)
	, m_to_3d_valid(0)
	, m_to_array_valid(0)
	, m_to_cubearray_valid(0)
	, m_tbo_valid(0)
	, m_fbo_invalid(0)
	, m_to_invalid(0)
	, m_to_layer_invalid(0)
	, m_color_attachment_invalid(0)
	, m_attachment_invalid(0)
	, m_level_invalid(0)
	, m_max_3d_texture_size(2048)		 /* OpenGL 4.5 Core Profile default values (Table 23.53). */
	, m_max_3d_texture_depth(2048)		 /* == m_max_3d_texture_size or value of GL_MAX_DEEP_3D_TEXTURE_DEPTH_NV. */
	, m_max_array_texture_layers(2048)   /* OpenGL 4.5 Core Profile default values (Table 23.53). */
	, m_max_cube_map_texture_size(16384) /* OpenGL 4.5 Core Profile default values (Table 23.53). */
{
	/* Intentionally left blank. */
}